

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int glfwGetInputMode(GLFWwindow *handle,int mode)

{
  int error;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
  }
  else {
    if (mode == 0x33003) {
      return (uint)(byte)handle[0x39];
    }
    if (mode == 0x33002) {
      return (uint)(byte)handle[0x38];
    }
    if (mode == 0x33001) {
      return *(int *)(handle + 0x50);
    }
    error = 0x10003;
  }
  _glfwInputError(error,(char *)0x0);
  return 0;
}

Assistant:

GLFWAPI int glfwGetInputMode(GLFWwindow* handle, int mode)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (mode)
    {
        case GLFW_CURSOR:
            return window->cursorMode;
        case GLFW_STICKY_KEYS:
            return window->stickyKeys;
        case GLFW_STICKY_MOUSE_BUTTONS:
            return window->stickyMouseButtons;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, NULL);
            return 0;
    }
}